

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O2

FPlayerSoundHashTable * __thiscall
FPlayerSoundHashTable::operator=(FPlayerSoundHashTable *this,FPlayerSoundHashTable *other)

{
  Entry *pEVar1;
  int i;
  long lVar2;
  
  Free(this);
  for (lVar2 = 0; lVar2 != 0x17; lVar2 = lVar2 + 1) {
    pEVar1 = (Entry *)(other->Buckets + lVar2);
    while (pEVar1 = pEVar1->Next, pEVar1 != (Entry *)0x0) {
      AddSound(this,pEVar1->PlayerSoundID,pEVar1->SfxID);
    }
  }
  return this;
}

Assistant:

FPlayerSoundHashTable &FPlayerSoundHashTable::operator= (const FPlayerSoundHashTable &other)
{
	Free ();
	for (int i = 0; i < NUM_BUCKETS; ++i)
	{
		Entry *entry;

		for (entry = other.Buckets[i]; entry != NULL; entry = entry->Next)
		{
			AddSound (entry->PlayerSoundID, entry->SfxID);
		}
	}
	return *this;
}